

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QMarginsF *m)

{
  long lVar1;
  _func_int **pp_Var2;
  QDebug *pQVar3;
  double *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)m);
  *(undefined1 *)((long)m->m_left + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)m,"QMarginsF");
  QDebug::operator<<(pQVar3,'(');
  pQVar3 = QDebug::operator<<((QDebug *)m,*in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX[1]);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX[2]);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  QDebug::operator<<(pQVar3,in_RDX[3]);
  QDebug::operator<<((QDebug *)m,')');
  pp_Var2 = (_func_int **)m->m_left;
  m->m_left = 0.0;
  ((dbg.stream)->ts)._vptr_QTextStream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QMarginsF &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QMarginsF" << '(';
    QtDebugUtils::formatQMargins(dbg, m);
    dbg << ')';
    return dbg;
}